

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__float_postprocess(float *result,int *x,int *y,int *comp,int req_comp)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int local_4c;
  int local_44;
  float temp;
  int z;
  int col;
  int row;
  int depth;
  int h;
  int w;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  float *result_local;
  
  if ((stbi__vertically_flip_on_load != 0) && (result != (float *)0x0)) {
    iVar2 = *x;
    iVar3 = *y;
    local_4c = req_comp;
    if (req_comp == 0) {
      local_4c = *comp;
    }
    for (z = 0; z < iVar3 >> 1; z = z + 1) {
      for (temp = 0.0; (int)temp < iVar2; temp = (float)((int)temp + 1)) {
        for (local_44 = 0; local_44 < local_4c; local_44 = local_44 + 1) {
          fVar1 = result[(z * iVar2 + (int)temp) * local_4c + local_44];
          result[(z * iVar2 + (int)temp) * local_4c + local_44] =
               result[(((iVar3 - z) + -1) * iVar2 + (int)temp) * local_4c + local_44];
          result[(((iVar3 - z) + -1) * iVar2 + (int)temp) * local_4c + local_44] = fVar1;
        }
      }
    }
  }
  return;
}

Assistant:

static void stbi__float_postprocess(float *result, int *x, int *y, int *comp, int req_comp)
{
   if (stbi__vertically_flip_on_load && result != NULL) {
      int w = *x, h = *y;
      int depth = req_comp ? req_comp : *comp;
      int row,col,z;
      float temp;

      // @OPTIMIZE: use a bigger temp buffer and memcpy multiple pixels at once
      for (row = 0; row < (h>>1); row++) {
         for (col = 0; col < w; col++) {
            for (z = 0; z < depth; z++) {
               temp = result[(row * w + col) * depth + z];
               result[(row * w + col) * depth + z] = result[((h - row - 1) * w + col) * depth + z];
               result[((h - row - 1) * w + col) * depth + z] = temp;
            }
         }
      }
   }
}